

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall crnd::crn_unpacker::decode_palettes(crn_unpacker *this)

{
  uchar uVar1;
  ushort uVar2;
  bool bVar3;
  crn_header *pcVar4;
  
  pcVar4 = this->m_pHeader;
  uVar2 = *(ushort *)(pcVar4->m_color_endpoints).m_num.m_buf;
  if ((uVar2 & 0xff) != 0 || uVar2 >> 8 != 0) {
    bVar3 = decode_color_endpoints(this);
    if (!bVar3) {
      return false;
    }
    bVar3 = decode_color_selectors(this);
    if (!bVar3) {
      return false;
    }
    pcVar4 = this->m_pHeader;
  }
  uVar2 = *(ushort *)(pcVar4->m_alpha_endpoints).m_num.m_buf;
  if ((uVar2 & 0xff) == 0 && uVar2 >> 8 == 0) {
    return true;
  }
  bVar3 = decode_alpha_endpoints(this);
  if (bVar3) {
    uVar1 = (this->m_pHeader->m_format).m_buf[0];
    if (uVar1 == '\f') {
      bVar3 = decode_alpha_selectors_etc(this);
    }
    else if (uVar1 == '\x0e') {
      bVar3 = decode_alpha_selectors_etcs(this);
    }
    else {
      bVar3 = decode_alpha_selectors(this);
    }
    if (bVar3 != false) {
      return true;
    }
  }
  return false;
}

Assistant:

bool decode_palettes()
        {
            if (m_pHeader->m_color_endpoints.m_num)
            {
                if (!decode_color_endpoints())
                    return false;
                if (!decode_color_selectors())
                    return false;
            }

            if (m_pHeader->m_alpha_endpoints.m_num)
            {
                if (!decode_alpha_endpoints())
                    return false;
                if (!(m_pHeader->m_format == cCRNFmtETC2AS ? decode_alpha_selectors_etcs() : m_pHeader->m_format == cCRNFmtETC2A ? decode_alpha_selectors_etc() : decode_alpha_selectors()))
                    return false;
            }

            return true;
        }